

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O2

void __thiscall
IntrusiveListTest_splice_range_Test::TestBody(IntrusiveListTest_splice_range_Test *this)

{
  TestObject *__len;
  TestObject *__offin;
  vector<int,_std::allocator<int>_> *data_values;
  vector<int,_std::allocator<int>_> *data_values_00;
  difference_type __n;
  vector<int,_std::allocator<int>_> *expected;
  vector<int,_std::allocator<int>_> *expected_00;
  vector<int,_std::allocator<int>_> *data_values_01;
  vector<int,_std::allocator<int>_> *expected_01;
  vector<int,_std::allocator<int>_> *expected_02;
  vector<int,_std::allocator<int>_> *data_values_02;
  vector<int,_std::allocator<int>_> *expected_03;
  vector<int,_std::allocator<int>_> *expected_04;
  int iVar1;
  iterator iVar2;
  iterator __x;
  iterator __x_00;
  int __flags;
  TestObjectList local_108;
  undefined4 uStack_f0;
  undefined4 uStack_ec;
  TestObjectList list3;
  TestObjectList list4;
  TestObjectList local_78;
  TestObjectList list2;
  TestObjectList list1;
  
  list2.first_ = (TestObject *)0x200000001;
  list2.last_._0_4_ = 3;
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list2);
  anon_unknown.dwarf_599a8::IntrusiveListTest::NewList
            (&list1,(IntrusiveListTest *)&local_108,data_values);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  list3.first_ = (TestObject *)0xc800000064;
  list3.last_ = (TestObject *)CONCAT44(list3.last_._4_4_,300);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list3);
  anon_unknown.dwarf_599a8::IntrusiveListTest::NewList
            (&list2,(IntrusiveListTest *)&local_108,data_values_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  __offin = list1.first_;
  __len = list2.first_;
  iVar2.node_ = (TestObject *)0x0;
  iVar2.list_ = &list2;
  iVar2 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(iVar2,__n);
  iVar1 = (int)&list1;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,iVar1,(__off64_t *)__offin,(int)&list2,(__off64_t *)&list2,(size_t)__len,
             (uint)iVar2.list_);
  list3.first_ = (TestObject *)0xc800000064;
  list3.last_ = (TestObject *)0x200000001;
  list3.size_._0_4_ = 3;
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list3,
             (undefined1 *)((long)&list3.size_ + 4));
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_108,expected);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  list3.first_ = (TestObject *)CONCAT44(list3.first_._4_4_,300);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list3,
             (undefined1 *)((long)&list3.first_ + 4));
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list2,&local_108,expected_00);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  list4.first_ = (TestObject *)0x258000001f4;
  list4.last_ = (TestObject *)CONCAT44(list4.last_._4_4_,700);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list4);
  anon_unknown.dwarf_599a8::IntrusiveListTest::NewList
            (&list3,(IntrusiveListTest *)&local_108,data_values_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  __x.node_ = list3.first_;
  __x.list_ = &list3;
  iVar2 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x,1);
  __flags = (int)&list3;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,iVar1,(__off64_t *)0x0,__flags,(__off64_t *)iVar2.list_,(size_t)iVar2.node_,
             __flags);
  local_108.size_._0_4_ = 3;
  local_108.size_._4_4_ = 600;
  uStack_f0 = 700;
  local_108.first_ = (TestObject *)0xc800000064;
  local_108.last_._0_4_ = 1;
  local_108.last_._4_4_ = 2;
  list4.first_ = (TestObject *)0x0;
  list4.last_ = (TestObject *)0x0;
  list4.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&list4,&local_108,&uStack_ec);
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&list4,expected_01);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&list4);
  list4.first_ = (TestObject *)CONCAT44(list4.first_._4_4_,500);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&list4,
             (undefined1 *)((long)&list4.first_ + 4));
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list3,&local_108,expected_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  local_78.first_ = (TestObject *)CONCAT44(local_78.first_._4_4_,400);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_108,&local_78);
  anon_unknown.dwarf_599a8::IntrusiveListTest::NewList
            (&list4,(IntrusiveListTest *)&local_108,data_values_02);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  __x_00.node_ = list1.first_;
  __x_00.list_ = &list1;
  iVar2 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>(__x_00,4);
  iVar1 = (int)&list4;
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::splice
            (&list1,(int)iVar2.list_,(__off64_t *)iVar2.node_,iVar1,(__off64_t *)&list4,
             (size_t)list4.first_,iVar1);
  local_108.size_._0_4_ = 400;
  local_108.size_._4_4_ = 3;
  uStack_f0 = 600;
  uStack_ec = 700;
  local_108.first_ = (TestObject *)0xc800000064;
  local_108.last_._0_4_ = 1;
  local_108.last_._4_4_ = 2;
  local_78.first_ = (TestObject *)0x0;
  local_78.last_ = (TestObject *)0x0;
  local_78.size_ = 0;
  std::vector<int,std::allocator<int>>::_M_range_initialize<int_const*>
            ((vector<int,std::allocator<int>> *)&local_78,&local_108,&list3);
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list1,&local_78,expected_03);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_78);
  local_108.first_ = (TestObject *)0x0;
  local_108.last_._0_4_ = 0;
  local_108.last_._4_4_ = 0;
  local_108.size_._0_4_ = 0;
  local_108.size_._4_4_ = 0;
  anon_unknown.dwarf_599a8::IntrusiveListTest::AssertListEq
            ((IntrusiveListTest *)&list4,&local_108,expected_04);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            ((_Vector_base<int,_std::allocator<int>_> *)&local_108);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list4);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list3);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list2);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::clear(&list1);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, splice_range) {
  TestObjectList list1 = NewList({1, 2, 3});

  // Splice at beginning.
  TestObjectList list2 = NewList({100, 200, 300});
  list1.splice(list1.begin(), list2, list2.begin(), std::prev(list2.end()));
  AssertListEq(list1, {100, 200, 1, 2, 3});
  AssertListEq(list2, {300});

  // Splice at end.
  TestObjectList list3 = NewList({500, 600, 700});
  list1.splice(list1.end(), list3, std::next(list3.begin()), list3.end());
  AssertListEq(list1, {100, 200, 1, 2, 3, 600, 700});
  AssertListEq(list3, {500});

  // Splice in the middle.
  TestObjectList list4 = NewList({400});
  list1.splice(std::next(list1.begin(), 4), list4, list4.begin(), list4.end());
  AssertListEq(list1, {100, 200, 1, 2, 400, 3, 600, 700});
  AssertListEq(list4, {});
}